

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O0

void __thiscall
SQLite::Database::Database
          (Database *this,string *aFilename,int aFlags,int aBusyTimeoutMs,string *aVfs)

{
  int ret_00;
  char *filename;
  ulong uVar1;
  Exception *this_00;
  char *local_80;
  undefined1 local_58 [8];
  Exception exception;
  int ret;
  string *aVfs_local;
  int aBusyTimeoutMs_local;
  int aFlags_local;
  string *aFilename_local;
  Database *this_local;
  
  this->mpSQLite = (sqlite3 *)0x0;
  std::__cxx11::string::string((string *)&this->mFilename,(string *)aFilename);
  filename = (char *)std::__cxx11::string::c_str();
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    local_80 = (char *)std::__cxx11::string::c_str();
  }
  else {
    local_80 = (char *)0x0;
  }
  ret_00 = sqlite3_open_v2(filename,&this->mpSQLite,aFlags,local_80);
  if (ret_00 != 0) {
    Exception::Exception((Exception *)local_58,this->mpSQLite,ret_00);
    sqlite3_close(this->mpSQLite);
    this_00 = (Exception *)__cxa_allocate_exception(0x18);
    Exception::Exception(this_00,(Exception *)local_58);
    __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
  }
  if (0 < aBusyTimeoutMs) {
    setBusyTimeout(this,aBusyTimeoutMs);
  }
  return;
}

Assistant:

Database::Database(const std::string& aFilename,
                   const int          aFlags         /* = SQLite::OPEN_READONLY*/,
                   const int          aBusyTimeoutMs /* = 0 */,
                   const std::string& aVfs           /* = "" */) :
    mpSQLite(nullptr),
    mFilename(aFilename)
{
    const int ret = sqlite3_open_v2(aFilename.c_str(), &mpSQLite, aFlags, aVfs.empty() ? nullptr : aVfs.c_str());
    if (SQLITE_OK != ret)
    {
        const SQLite::Exception exception(mpSQLite, ret); // must create before closing
        sqlite3_close(mpSQLite); // close is required even in case of error on opening
        throw exception;
    }
    if (aBusyTimeoutMs > 0)
    {
        setBusyTimeout(aBusyTimeoutMs);
    }
}